

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

optional<std::shared_ptr<ObjectDeclarationExpressionAstNode>_> * __thiscall
Parser::parseObjectDeclarationExpression
          (optional<std::shared_ptr<ObjectDeclarationExpressionAstNode>_> *__return_storage_ptr__,
          Parser *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  int iVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  optional<std::shared_ptr<ObjectDeclarationExpressionAstNode>_> *poVar3;
  TokenType type;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_01;
  undefined1 local_100 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_e8;
  undefined1 local_e0 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_c8;
  undefined1 local_c0 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_a8;
  undefined1 local_a0 [8];
  optional<std::shared_ptr<ExpressionAstNode>_> value;
  vector<std::pair<std::shared_ptr<Token>,_std::shared_ptr<ExpressionAstNode>_>,_std::allocator<std::pair<std::shared_ptr<Token>,_std::shared_ptr<ExpressionAstNode>_>_>_>
  keyValues;
  shared_ptr<Token> key;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_58 [3];
  optional<std::shared_ptr<ObjectDeclarationExpressionAstNode>_> *local_40;
  allocator<char> local_32;
  char local_31;
  bool error;
  
  local_31 = '\0';
  local_40 = __return_storage_ptr__;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&key.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             "Expected a left curly bracket to begin object declaration",
             (allocator<char> *)
             &value.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>.
              _M_payload.
              super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
              super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._M_engaged);
  this_00 = &key.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  type = (TokenType)this;
  expect((Parser *)local_100,type,(bool *)0x2,(string *)&local_31);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_100 + 8));
  std::__cxx11::string::~string((string *)this_00);
  value.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>._M_payload.
  super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
  super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._M_engaged = false;
  value.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>._M_payload.
  super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
  super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._17_7_ = 0;
  keyValues.
  super__Vector_base<std::pair<std::shared_ptr<Token>,_std::shared_ptr<ExpressionAstNode>_>,_std::allocator<std::pair<std::shared_ptr<Token>,_std::shared_ptr<ExpressionAstNode>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  keyValues.
  super__Vector_base<std::pair<std::shared_ptr<Token>,_std::shared_ptr<ExpressionAstNode>_>,_std::allocator<std::pair<std::shared_ptr<Token>,_std::shared_ptr<ExpressionAstNode>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  while( true ) {
    skipWhiteSpace(this);
    TokenBuffer::currentToken((TokenBuffer *)this_00);
    iVar1 = *(int *)&key.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[2].
                     _vptr__Sp_counted_base;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_58);
    if (iVar1 == 1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&key.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                 "Expected a right curly bracket to end object declaration",
                 (allocator<char> *)local_a0);
      expect((Parser *)(local_100 + 0x10),type,(bool *)0x3,(string *)&local_31);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_e8);
      std::__cxx11::string::~string
                ((string *)&key.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      goto LAB_0010c6aa;
    }
    TokenBuffer::currentToken((TokenBuffer *)this_00);
    iVar1 = *(int *)&key.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[2].
                     _vptr__Sp_counted_base;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_58);
    if (iVar1 == 3) break;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)this_00,"Expected identifier as parameter of function definition",
               (allocator<char> *)local_a0);
    expect((Parser *)
           &keyValues.
            super__Vector_base<std::pair<std::shared_ptr<Token>,_std::shared_ptr<ExpressionAstNode>_>,_std::allocator<std::pair<std::shared_ptr<Token>,_std::shared_ptr<ExpressionAstNode>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage,type,(bool *)0x18,(string *)&local_31
          );
    std::__cxx11::string::~string((string *)this_00);
    if (*(int *)&keyValues.
                 super__Vector_base<std::pair<std::shared_ptr<Token>,_std::shared_ptr<ExpressionAstNode>_>,_std::allocator<std::pair<std::shared_ptr<Token>,_std::shared_ptr<ExpressionAstNode>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage[1].first.
                 super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr != 0x18) {
      local_31 = '\x01';
    }
    skipWhiteSpace(this);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)this_00,"Expected a colon between object key and value",
               (allocator<char> *)local_a0);
    expect((Parser *)(local_e0 + 0x10),type,(bool *)0x17,(string *)&local_31);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_c8);
    std::__cxx11::string::~string((string *)this_00);
    parseExpression((optional<std::shared_ptr<ExpressionAstNode>_> *)local_a0,this);
    if (value.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>._M_payload.
        super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
        super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._M_payload._8_1_ == '\x01'
       ) {
      if (local_31 == '\0') {
        std::
        vector<std::pair<std::shared_ptr<Token>,std::shared_ptr<ExpressionAstNode>>,std::allocator<std::pair<std::shared_ptr<Token>,std::shared_ptr<ExpressionAstNode>>>>
        ::emplace_back<std::shared_ptr<Token>&,std::shared_ptr<ExpressionAstNode>&>
                  ((vector<std::pair<std::shared_ptr<Token>,std::shared_ptr<ExpressionAstNode>>,std::allocator<std::pair<std::shared_ptr<Token>,std::shared_ptr<ExpressionAstNode>>>>
                    *)&value.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>.
                       _M_payload.
                       super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>
                       .super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._M_engaged
                   ,(shared_ptr<Token> *)
                    &keyValues.
                     super__Vector_base<std::pair<std::shared_ptr<Token>,_std::shared_ptr<ExpressionAstNode>_>,_std::allocator<std::pair<std::shared_ptr<Token>,_std::shared_ptr<ExpressionAstNode>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,
                   (shared_ptr<ExpressionAstNode> *)local_a0);
      }
    }
    else {
      local_31 = '\x01';
    }
    TokenBuffer::currentToken((TokenBuffer *)this_00);
    iVar1 = *(int *)&key.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[2].
                     _vptr__Sp_counted_base;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_58);
    if (iVar1 == 3) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)this_00,"Expected a right curly bracket to end object declaration",
                 &local_32);
      expect((Parser *)local_c0,type,(bool *)0x3,(string *)&local_31);
      this_01 = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_c0 + 8);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)this_00,"Expected a comma between object key-value pairs",&local_32);
      expect((Parser *)(local_c0 + 0x10),type,(bool *)0x13,(string *)&local_31);
      this_01 = &local_a8;
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(this_01);
    std::__cxx11::string::~string((string *)this_00);
    std::_Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>::_M_reset
              ((_Optional_payload_base<std::shared_ptr<ExpressionAstNode>_> *)local_a0);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&key);
    if (iVar1 == 3) {
LAB_0010c6a4:
      if (local_31 == '\x01') {
LAB_0010c6aa:
        (local_40->
        super__Optional_base<std::shared_ptr<ObjectDeclarationExpressionAstNode>,_false,_false>).
        _M_payload.
        super__Optional_payload<std::shared_ptr<ObjectDeclarationExpressionAstNode>,_true,_false,_false>
        .super__Optional_payload_base<std::shared_ptr<ObjectDeclarationExpressionAstNode>_>.
        _M_engaged = false;
        poVar3 = local_40;
      }
      else {
        std::
        make_shared<ObjectDeclarationExpressionAstNode,std::vector<std::pair<std::shared_ptr<Token>,std::shared_ptr<ExpressionAstNode>>,std::allocator<std::pair<std::shared_ptr<Token>,std::shared_ptr<ExpressionAstNode>>>>&>
                  ((vector<std::pair<std::shared_ptr<Token>,_std::shared_ptr<ExpressionAstNode>_>,_std::allocator<std::pair<std::shared_ptr<Token>,_std::shared_ptr<ExpressionAstNode>_>_>_>
                    *)&key.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        poVar3 = local_40;
        _Var2._M_pi = local_58[0]._M_pi;
        (local_40->
        super__Optional_base<std::shared_ptr<ObjectDeclarationExpressionAstNode>,_false,_false>).
        _M_payload.
        super__Optional_payload<std::shared_ptr<ObjectDeclarationExpressionAstNode>,_true,_false,_false>
        .super__Optional_payload_base<std::shared_ptr<ObjectDeclarationExpressionAstNode>_>.
        _M_payload._M_value.
        super___shared_ptr<ObjectDeclarationExpressionAstNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)
             key.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
        local_58[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
        ((long)&(local_40->
                super__Optional_base<std::shared_ptr<ObjectDeclarationExpressionAstNode>,_false,_false>
                )._M_payload.
                super__Optional_payload<std::shared_ptr<ObjectDeclarationExpressionAstNode>,_true,_false,_false>
                .super__Optional_payload_base<std::shared_ptr<ObjectDeclarationExpressionAstNode>_>.
                _M_payload._M_value.
                super___shared_ptr<ObjectDeclarationExpressionAstNode,_(__gnu_cxx::_Lock_policy)2> +
        8))->_M_pi = _Var2._M_pi;
        key.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        (local_40->
        super__Optional_base<std::shared_ptr<ObjectDeclarationExpressionAstNode>,_false,_false>).
        _M_payload.
        super__Optional_payload<std::shared_ptr<ObjectDeclarationExpressionAstNode>,_true,_false,_false>
        .super__Optional_payload_base<std::shared_ptr<ObjectDeclarationExpressionAstNode>_>.
        _M_engaged = true;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_58);
      }
      std::
      vector<std::pair<std::shared_ptr<Token>,_std::shared_ptr<ExpressionAstNode>_>,_std::allocator<std::pair<std::shared_ptr<Token>,_std::shared_ptr<ExpressionAstNode>_>_>_>
      ::~vector((vector<std::pair<std::shared_ptr<Token>,_std::shared_ptr<ExpressionAstNode>_>,_std::allocator<std::pair<std::shared_ptr<Token>,_std::shared_ptr<ExpressionAstNode>_>_>_>
                 *)&value.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>.
                    _M_payload.
                    super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
                    super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._M_engaged);
      return poVar3;
    }
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&key.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             "Expected a right curly bracket to end object declaration",(allocator<char> *)local_a0)
  ;
  expect((Parser *)local_e0,type,(bool *)0x3,(string *)&local_31);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_e0 + 8));
  std::__cxx11::string::~string
            ((string *)&key.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  goto LAB_0010c6a4;
}

Assistant:

const std::optional<std::shared_ptr<ObjectDeclarationExpressionAstNode>>
Parser::parseObjectDeclarationExpression() noexcept {
  bool error = false;
  this->expect(TokenType::LeftCurly, error,
    "Expected a left curly bracket to begin object declaration");

  std::vector<std::pair<std::shared_ptr<Token>, std::shared_ptr<ExpressionAstNode>>> keyValues;

  while (true) {
    this->skipWhiteSpace();

    if (this->tokenBuffer->currentToken()->tokenType == TokenType::EndOfFile) {
      this->expect(TokenType::RightCurly, error,
        "Expected a right curly bracket to end object declaration");
      return std::nullopt;
    }

    if (this->tokenBuffer->currentToken()->tokenType == TokenType::RightCurly) {
      this->expect(TokenType::RightCurly, error,
        "Expected a right curly bracket to end object declaration");
      break;
    }

    auto key = this->expect(TokenType::Identifier, error,
      "Expected identifier as parameter of function definition");

    if (key->tokenType != TokenType::Identifier) {
      error = true;
    }

    this->skipWhiteSpace();

    this->expect(TokenType::Colon, error, "Expected a colon between object key and value");

    auto value = this->parseExpression();

    if (!value) {
      error = true;
    }

    if (!error) {
      keyValues.emplace_back(key, value.value());
    }

    if (this->tokenBuffer->currentToken()->tokenType == TokenType::RightCurly) {
      this->expect(TokenType::RightCurly, error,
        "Expected a right curly bracket to end object declaration");
      break;
    }

    this->expect(TokenType::Comma, error, "Expected a comma between object key-value pairs");
  }

  if (error) { return std::nullopt; }

  return std::make_shared<ObjectDeclarationExpressionAstNode>(keyValues);
}